

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAiger.c
# Opt level: O1

Vec_Int_t * Gia_AigerReadLiterals(uchar **ppPos,int nEntries)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p;
  int *piVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  uint uVar9;
  int iVar10;
  
  p = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < nEntries - 1U) {
    iVar10 = nEntries;
  }
  p->nSize = 0;
  p->nCap = iVar10;
  bVar5 = 0;
  if (iVar10 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar10 << 2);
  }
  p->pArray = piVar4;
  pbVar8 = *ppPos;
  *ppPos = pbVar8 + 1;
  uVar2 = (uint)*pbVar8;
  if ((char)*pbVar8 < '\0') {
    pbVar8 = pbVar8 + 2;
    bVar5 = 0;
    uVar9 = 0;
    do {
      uVar9 = uVar9 | (uVar2 & 0x7f) << (bVar5 & 0x1f);
      *ppPos = pbVar8;
      pbVar1 = pbVar8 + -1;
      uVar2 = (uint)*pbVar1;
      pbVar8 = pbVar8 + 1;
      bVar5 = bVar5 + 7;
    } while ((char)*pbVar1 < '\0');
  }
  else {
    uVar9 = 0;
  }
  uVar9 = uVar2 << (bVar5 & 0x1f) | uVar9;
  Vec_IntPush(p,uVar9);
  if (1 < nEntries) {
    iVar10 = 1;
    do {
      pbVar8 = *ppPos;
      *ppPos = pbVar8 + 1;
      uVar2 = (uint)*pbVar8;
      bVar5 = 0;
      if ((char)*pbVar8 < '\0') {
        pbVar8 = pbVar8 + 2;
        bVar5 = 0;
        uVar3 = 0;
        do {
          uVar3 = uVar3 | (uVar2 & 0x7f) << (bVar5 & 0x1f);
          *ppPos = pbVar8;
          pbVar1 = pbVar8 + -1;
          uVar2 = (uint)*pbVar1;
          pbVar8 = pbVar8 + 1;
          bVar5 = bVar5 + 7;
        } while ((char)*pbVar1 < '\0');
      }
      else {
        uVar3 = 0;
      }
      uVar3 = uVar2 << (bVar5 & 0x1f) | uVar3;
      iVar6 = (int)uVar3 >> 1;
      iVar7 = -iVar6;
      if ((uVar3 & 1) == 0) {
        iVar7 = iVar6;
      }
      uVar9 = uVar9 + iVar7;
      Vec_IntPush(p,uVar9);
      iVar10 = iVar10 + 1;
    } while (iVar10 != nEntries);
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_AigerReadLiterals( unsigned char ** ppPos, int nEntries )
{
    Vec_Int_t * vLits;
    int Lit, LitPrev, Diff, i;
    vLits = Vec_IntAlloc( nEntries );
    LitPrev = Gia_AigerReadUnsigned( ppPos );
    Vec_IntPush( vLits, LitPrev );
    for ( i = 1; i < nEntries; i++ )
    {
//        Diff = Lit - LitPrev;
//        Diff = (Lit < LitPrev)? -Diff : Diff;
//        Diff = ((2 * Diff) << 1) | (int)(Lit < LitPrev);
        Diff = Gia_AigerReadUnsigned( ppPos );
        Diff = (Diff & 1)? -(Diff >> 1) : Diff >> 1;
        Lit  = Diff + LitPrev;
        Vec_IntPush( vLits, Lit );
        LitPrev = Lit;
    }
    return vLits;
}